

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O2

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseLeaf
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,
          string *fieldName,SField *name,Value *value,Value *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  char cVar1;
  bool bVar2;
  uchar uVar3;
  enable_if_t<std::is_unsigned<unsigned_short>::value_&&_std::is_unsigned<unsigned_int>::value,_unsigned_short>
  eVar4;
  enable_if_t<std::is_unsigned<unsigned_short>::value_&&_std::is_signed<int>::value,_unsigned_short>
  eVar5;
  unsigned_short uVar6;
  TxType TVar7;
  UInt UVar8;
  Int IVar9;
  LedgerEntryType LVar10;
  SField *name_00;
  ostream *poVar11;
  Value *this;
  reference_const_type pbVar12;
  Value *pVVar13;
  reference_type pTVar14;
  uint *args_1;
  STPathSet *args;
  string *s;
  string *s_00;
  STVector256 *args_00;
  string *s_01;
  byte bVar15;
  UInt UVar16;
  ulong uVar17;
  string sVar18;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool bVar19;
  int iVar20;
  bool hasCurrency;
  string strValue;
  string element_name;
  STVar st;
  optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> a;
  Currency uCurrency;
  AccountID uIssuer;
  AccountID uAccount;
  STPath p;
  Value pathEl;
  bool local_3ba;
  allocator local_3b9;
  ulong local_3b8;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  uint32_t local_380 [6];
  undefined1 local_368 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [2];
  undefined1 local_328 [16];
  undefined1 local_318 [384];
  Value *local_198;
  ulong local_190;
  allocator local_188 [16];
  ValueHolder local_178 [4];
  base_uint<160UL,_jbcoin::detail::CurrencyTag> local_158;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_138;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_118;
  _Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> local_f8;
  Value local_e0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  pVVar13 = value;
  name_00 = SField::getField(fieldName);
  if (name_00->fieldCode == sfInvalid) {
    unknown_field((STParsedJSONDetail *)local_328,json_name,fieldName);
    goto LAB_001eacf3;
  }
  args_1 = &switchD_001ead41::switchdataD_0028c5a0;
  switch(name_00->fieldType) {
  case STI_UINT16:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar9 = Json::Value::asInt((Value *)name);
      eVar5 = to_unsigned<unsigned_short,int>(IVar9);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa690;
      local_318._0_2_ = eVar5;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 == '\x02') {
      UVar16 = Json::Value::asUInt((Value *)name);
      eVar4 = to_unsigned<unsigned_short,unsigned_int>(UVar16);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa690;
      local_318._0_2_ = eVar4;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    if (((SField *)local_3b0._8_8_ == (SField *)0x0) ||
       (0xf5 < (byte)(*(char *)local_3b0._0_8_ - 0x3aU))) {
      std::__cxx11::string::string((string *)&local_b0,(string *)local_3b0);
      uVar6 = beast::lexicalCastThrow<unsigned_short,std::__cxx11::string>(&local_b0);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa690;
      local_318._0_2_ = uVar6;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      detail::STVar::~STVar((STVar *)local_328);
      this_01 = &local_b0;
LAB_001ebe90:
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      if (name_00->fieldCode == sfTransactionType) {
        TxFormats::getInstance();
        std::__cxx11::string::string((string *)&local_70,(string *)local_3b0);
        TVar7 = KnownFormats<jbcoin::TxType>::findTypeByName
                          (&TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>,
                           &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        local_318._64_8_ = local_328;
        local_328._0_8_ = &PTR__STBase_002fa690;
        local_318._0_2_ = (short)TVar7;
        local_328._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      }
      else {
        if (name_00->fieldCode != sfLedgerEntryType) {
          invalid_data((STParsedJSONDetail *)local_328,json_name,fieldName);
          goto LAB_001ebfc7;
        }
        LedgerFormats::getInstance();
        std::__cxx11::string::string((string *)&local_90,(string *)local_3b0);
        LVar10 = KnownFormats<jbcoin::LedgerEntryType>::findTypeByName
                           (&LedgerFormats::getInstance::instance.
                             super_KnownFormats<jbcoin::LedgerEntryType>,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        local_318._64_8_ = local_328;
        local_328._0_8_ = &PTR__STBase_002fa690;
        local_318._0_2_ = (short)LVar10;
        local_328._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      }
LAB_001ec021:
      detail::STVar::~STVar((STVar *)local_328);
    }
    sVar18 = (string)0x1;
    bVar15 = 0;
    goto LAB_001ebe9a;
  case STI_UINT32:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar9 = Json::Value::asInt((Value *)name);
      local_318._0_4_ = to_unsigned<unsigned_int,int>(IVar9);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa710;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 == '\x02') {
      UVar16 = Json::Value::asUInt((Value *)name);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa710;
      local_318._0_4_ = UVar16;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_(&local_d0,(Value *)name);
    local_318._0_4_ = beast::lexicalCastThrow<unsigned_int,std::__cxx11::string>(&local_d0);
    local_318._64_8_ = local_328;
    local_328._0_8_ = &PTR__STBase_002fa710;
    local_328._8_8_ = name_00;
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
    detail::STVar::~STVar((STVar *)local_328);
    this_00 = &local_d0;
    goto LAB_001eb93e;
  case STI_UINT64:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar9 = Json::Value::asInt((Value *)name);
      local_318._0_8_ = to_unsigned<unsigned_long,int>(IVar9);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa778;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 == '\x02') {
      UVar16 = Json::Value::asUInt((Value *)name);
      local_318._0_8_ = ZEXT48(UVar16);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa778;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    local_318._0_8_ = uintFromHex((string *)local_3b0);
    local_318._64_8_ = local_328;
    local_328._0_8_ = &PTR__STBase_002fa778;
    local_328._8_8_ = name_00;
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
    break;
  case STI_HASH128:
    if ((char)name->fieldValue != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    detail::make_stvar<jbcoin::STBitString<128ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)local_328,(detail *)name_00,(SField *)local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
    break;
  case STI_HASH256:
    if ((char)name->fieldValue != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    detail::make_stvar<jbcoin::STBitString<256ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)local_328,(detail *)name_00,(SField *)local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
    break;
  case STI_AMOUNT:
    amountFromJson((STAmount *)local_3b0,name_00,(Value *)name);
    local_318._64_8_ = local_328;
    local_328._8_8_ = local_3b0._8_8_;
    local_328._0_8_ = &PTR__STBase_002f8010;
    local_318._0_8_ = local_3a0._M_allocated_capacity;
    local_318._8_8_ = local_3a0._8_8_;
    local_318._16_8_ = local_390._M_allocated_capacity;
    local_318._24_8_ = local_390._8_8_;
    local_318._32_4_ = local_380[0];
    local_318._36_4_ = local_380[1];
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
LAB_001eb5f9:
    detail::STVar::~STVar((STVar *)local_328);
    return __return_storage_ptr__;
  case STI_VL:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_328,(Value *)name);
      strUnHex((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_3b0,
               (string *)local_328);
      std::__cxx11::string::~string((string *)local_328);
      if (local_3a0._M_local_buf[8] != '\0') {
        local_368._0_8_ = local_3b0._0_8_;
        local_348[0]._0_8_ = local_3b0._8_8_ - local_3b0._0_8_;
        detail::make_stvar<jbcoin::STBlob,jbcoin::SField_const&,unsigned_char*,unsigned_long>
                  ((STVar *)local_328,(detail *)name_00,(SField *)local_368,
                   (uchar **)(local_368 + 0x20),(unsigned_long *)pVVar13);
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
        detail::STVar::~STVar((STVar *)local_328);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b0);
        return __return_storage_ptr__;
      }
      Throw<std::invalid_argument,char_const(&)[13]>((char (*) [13])"invalid data");
    }
    bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
    goto LAB_001eacf3;
  case STI_ACCOUNT:
    if ((char)name->fieldValue != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    parseHexOrBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_368,
               (jbcoin *)local_3b0,s_01);
    sVar18 = local_368[0];
    if (local_368[0] == (string)0x0) {
      invalid_data((STParsedJSONDetail *)local_328,json_name,fieldName);
      Json::Value::swap(value,(Value *)local_328);
      Json::Value::~Value((Value *)local_328);
    }
    else {
      pbVar12 = boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::get
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_368);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002f7f40;
      local_318._0_8_ = *(undefined8 *)pbVar12->pn;
      local_318._8_8_ = *(undefined8 *)(pbVar12->pn + 2);
      local_318._16_8_ = CONCAT44(SUB84(local_318._16_8_,4),pbVar12->pn[4]) & 0xffffff00ffffffff;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      detail::STVar::~STVar((STVar *)local_328);
    }
    bVar15 = (byte)sVar18 ^ 1;
    goto LAB_001ebe9a;
  default:
    bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
    goto LAB_001eacf3;
  case STI_UINT8:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar9 = Json::Value::asInt((Value *)name);
      if ((IVar9 < 0) || (IVar9 = Json::Value::asInt((Value *)name), 0xff < IVar9)) {
        out_of_range((STParsedJSONDetail *)local_328,json_name,fieldName);
        goto LAB_001eacf3;
      }
      IVar9 = Json::Value::asInt((Value *)name);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa610;
      local_318[0] = (char)IVar9;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      goto LAB_001eb5f9;
    }
    if (cVar1 == '\x02') {
      UVar16 = Json::Value::asUInt((Value *)name);
      if (UVar16 < 0x100) {
        UVar16 = Json::Value::asUInt((Value *)name);
        local_318._64_8_ = local_328;
        local_328._0_8_ = &PTR__STBase_002fa610;
        local_318[0] = (char)UVar16;
        local_328._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
        goto LAB_001eb5f9;
      }
      out_of_range((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    if (((SField *)local_3b0._8_8_ == (SField *)0x0) ||
       (0xf5 < (byte)(*(char *)local_3b0._0_8_ - 0x3aU))) {
      std::__cxx11::string::string((string *)&local_50,(string *)local_3b0);
      uVar3 = beast::lexicalCastThrow<unsigned_char,std::__cxx11::string>(&local_50);
      local_318._64_8_ = local_328;
      local_328._0_8_ = &PTR__STBase_002fa610;
      local_318[0] = uVar3;
      local_328._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
      detail::STVar::~STVar((STVar *)local_328);
      this_01 = &local_50;
      goto LAB_001ebe90;
    }
    if (name_00->fieldCode == sfTransactionResult) {
      local_368._0_8_ = transCode((string *)local_3b0);
      if ((((local_368._0_8_ & 1) != 0) &&
          (pTVar14 = boost::optional<jbcoin::TER>::get((optional<jbcoin::TER> *)local_368),
          ~tesSUCCESS < *pTVar14)) &&
         (pTVar14 = boost::optional<jbcoin::TER>::get((optional<jbcoin::TER> *)local_368),
         *pTVar14 < 0x100)) {
        pTVar14 = boost::optional<jbcoin::TER>::get((optional<jbcoin::TER> *)local_368);
        local_318._64_8_ = local_328;
        local_328._0_8_ = &PTR__STBase_002fa610;
        local_318[0] = (char)*pTVar14;
        local_328._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_318._64_8_);
        goto LAB_001ec021;
      }
      out_of_range((STParsedJSONDetail *)local_328,json_name,fieldName);
    }
    else {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
    }
LAB_001ebfc7:
    Json::Value::swap(value,(Value *)local_328);
    Json::Value::~Value((Value *)local_328);
    bVar15 = 1;
    sVar18 = (string)0x0;
LAB_001ebe9a:
    std::__cxx11::string::~string((string *)local_3b0);
    if (sVar18 != (string)0x0) {
      return __return_storage_ptr__;
    }
    if (bVar15 != 0) {
      return __return_storage_ptr__;
    }
LAB_001ebeb5:
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::~optional_base
              (&__return_storage_ptr__->super_type);
    return __return_storage_ptr__;
  case STI_HASH160:
    if ((char)name->fieldValue != '\x04') {
      bad_type((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    Json::Value::asString_abi_cxx11_((string *)local_3b0,(Value *)name);
    detail::make_stvar<jbcoin::STBitString<160ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)local_328,(detail *)name_00,(SField *)local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
    break;
  case STI_PATHSET:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 != '\0') && (cVar1 != '\x06')) {
      array_expected((STParsedJSONDetail *)local_328,json_name,fieldName);
      goto LAB_001eacf3;
    }
    local_3b0._0_8_ = &PTR__STPathSet_002f82c8;
    local_3a0._M_allocated_capacity = 0;
    local_3a0._8_8_ = 0;
    local_390._M_allocated_capacity = 0;
    uVar17 = 0;
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_368 + 0x20);
    bVar19 = false;
    local_3b0._8_8_ = name_00;
    do {
      local_3b8 = uVar17;
      UVar16 = Json::Value::size((Value *)name);
      uVar17 = local_3b8;
      if (UVar16 <= (uint)local_3b8) {
        detail::make_stvar<jbcoin::STPathSet,jbcoin::STPathSet>
                  ((STVar *)local_328,(detail *)local_3b0,args);
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
        detail::STVar::~STVar((STVar *)local_328);
        std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
                  ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&local_3a0);
        return __return_storage_ptr__;
      }
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVVar13 = Json::Value::operator[]((Value *)name,(uint)local_3b8);
      local_190 = uVar17 & 0xffffffff;
      if ((pVVar13->field_0x8 == '\x06') || (pVVar13->field_0x8 == '\0')) {
        uVar17 = 0;
        do {
          pVVar13 = Json::Value::operator[]((Value *)name,(UInt)local_3b8);
          UVar16 = Json::Value::size(pVVar13);
          if (UVar16 <= uVar17) {
            bVar2 = true;
            std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back
                      ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&local_3a0,
                       (value_type *)&local_f8);
            iVar20 = (int)local_3b8;
            goto LAB_001eb4fc;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_328);
          poVar11 = std::operator<<((ostream *)local_318,(string *)fieldName);
          poVar11 = std::operator<<(poVar11,"[");
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          poVar11 = std::operator<<(poVar11,"][");
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::operator<<(poVar11,"]");
          std::operator+(__return_storage_ptr___00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         json_name,".");
          std::__cxx11::stringbuf::str();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr___00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178);
          std::__cxx11::string::~string((string *)&local_178[0].bool_);
          std::__cxx11::string::~string((string *)__return_storage_ptr___00);
          pVVar13 = Json::Value::operator[]((Value *)name,(UInt)local_3b8);
          pVVar13 = Json::Value::operator[](pVVar13,(UInt)uVar17);
          Json::Value::Value(&local_e0,pVVar13);
          if ((local_e0._8_1_ == '\0') || (local_e0._8_1_ == '\a')) {
            pVVar13 = Json::Value::operator[](&local_e0,"account");
            this = Json::Value::operator[](&local_e0,"currency");
            local_198 = Json::Value::operator[](&local_e0,"issuer");
            local_3ba = false;
            local_118.pn[0] = 0;
            local_118.pn[1] = 0;
            local_118.pn[2] = 0;
            local_118.pn[3] = 0;
            local_118.pn[4] = 0;
            local_138.pn[0] = 0;
            local_138.pn[1] = 0;
            local_138.pn[2] = 0;
            local_138.pn[3] = 0;
            local_138.pn[4] = 0;
            local_158.pn[0] = 0;
            local_158.pn[1] = 0;
            local_158.pn[2] = 0;
            local_158.pn[3] = 0;
            local_158.pn[4] = 0;
            bVar2 = Json::Value::operator_cast_to_bool(pVVar13);
            if (bVar2) {
              if (pVVar13->field_0x8 == '\x04') {
                Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,pVVar13);
                bVar2 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                  (&local_118,(char *)local_348[0]._0_8_);
                std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                if (!bVar2) {
                  Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,pVVar13);
                  parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                            ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                             local_178,(jbcoin *)__return_storage_ptr___00,s);
                  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                  if ((bool)local_178[0]._0_1_ == false) {
                    std::__cxx11::string::string
                              ((string *)__return_storage_ptr___00,"account",&local_3b9);
                    invalid_data((STParsedJSONDetail *)local_188,(string *)local_368,
                                 (string *)__return_storage_ptr___00);
                    Json::Value::swap(value,(Value *)local_188);
                    Json::Value::~Value((Value *)local_188);
                    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                    goto LAB_001eb375;
                  }
                  pbVar12 = boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                            ::get((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                                   *)local_178);
                  base_uint<160UL,_jbcoin::detail::AccountIDTag>::operator=(&local_118,pbVar12);
                }
                goto LAB_001eb191;
              }
              std::__cxx11::string::string((string *)__return_storage_ptr___00,"account",local_188);
              string_expected((STParsedJSONDetail *)&local_178[0].bool_,(string *)local_368,
                              (string *)__return_storage_ptr___00);
LAB_001eb355:
              Json::Value::swap(value,(Value *)local_178);
              Json::Value::~Value((Value *)local_178);
              std::__cxx11::string::~string((string *)__return_storage_ptr___00);
              goto LAB_001eb375;
            }
LAB_001eb191:
            bVar2 = Json::Value::operator_cast_to_bool(this);
            if (bVar2) {
              if (this->field_0x8 != '\x04') {
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr___00,"currency",local_188);
                string_expected((STParsedJSONDetail *)&local_178[0].bool_,(string *)local_368,
                                (string *)__return_storage_ptr___00);
                goto LAB_001eb355;
              }
              local_3ba = true;
              Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,this);
              bVar2 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHexExact
                                (&local_158,(char *)local_348[0]._0_8_);
              std::__cxx11::string::~string((string *)__return_storage_ptr___00);
              if (!bVar2) {
                Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,this);
                bVar2 = to_currency(&local_158,(string *)__return_storage_ptr___00);
                std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                if (!bVar2) {
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr___00,"currency",local_188);
                  invalid_data((STParsedJSONDetail *)&local_178[0].bool_,(string *)local_368,
                               (string *)__return_storage_ptr___00);
                  goto LAB_001eb355;
                }
              }
            }
            pVVar13 = local_198;
            bVar2 = Json::Value::operator_cast_to_bool(local_198);
            if (bVar2) {
              if (pVVar13->field_0x8 != '\x04') {
                std::__cxx11::string::string((string *)__return_storage_ptr___00,"issuer",local_188)
                ;
                string_expected((STParsedJSONDetail *)&local_178[0].bool_,(string *)local_368,
                                (string *)__return_storage_ptr___00);
                goto LAB_001eb355;
              }
              Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,pVVar13);
              bVar2 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                (&local_138,(char *)local_348[0]._0_8_);
              std::__cxx11::string::~string((string *)__return_storage_ptr___00);
              if (!bVar2) {
                Json::Value::asString_abi_cxx11_((string *)__return_storage_ptr___00,local_198);
                parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_178,(jbcoin *)__return_storage_ptr___00,s_00);
                std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                if ((bool)local_178[0]._0_1_ == false) {
                  std::__cxx11::string::string
                            ((string *)__return_storage_ptr___00,"issuer",&local_3b9);
                  invalid_data((STParsedJSONDetail *)local_188,(string *)local_368,
                               (string *)__return_storage_ptr___00);
                  Json::Value::swap(value,(Value *)local_188);
                  Json::Value::~Value((Value *)local_188);
                  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
                  goto LAB_001eb375;
                }
                pbVar12 = boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::
                          get((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                              local_178);
                base_uint<160UL,_jbcoin::detail::AccountIDTag>::operator=(&local_138,pbVar12);
              }
            }
            bVar2 = true;
            std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
            emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,bool&>
                      ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)
                       &local_f8,&local_118,&local_158,&local_138,&local_3ba);
          }
          else {
            not_an_object((STParsedJSONDetail *)__return_storage_ptr___00,(string *)local_368);
            Json::Value::swap(value,(Value *)__return_storage_ptr___00);
            Json::Value::~Value((Value *)__return_storage_ptr___00);
LAB_001eb375:
            bVar19 = true;
            bVar2 = false;
          }
          Json::Value::~Value(&local_e0);
          std::__cxx11::string::~string((string *)local_368);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
          uVar17 = uVar17 + 1;
        } while (bVar2);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_328);
        poVar11 = std::operator<<((ostream *)local_318,(string *)fieldName);
        poVar11 = std::operator<<(poVar11,"[");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::operator<<(poVar11,"]");
        std::__cxx11::stringbuf::str();
        array_expected((STParsedJSONDetail *)__return_storage_ptr___00,json_name,(string *)local_368
                      );
        Json::Value::swap(value,(Value *)__return_storage_ptr___00);
        Json::Value::~Value((Value *)__return_storage_ptr___00);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
        bVar19 = true;
      }
      bVar2 = false;
      iVar20 = (int)local_3b8;
LAB_001eb4fc:
      std::_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::
      ~_Vector_base(&local_f8);
      uVar17 = (ulong)(iVar20 + 1);
    } while (bVar2);
    std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
              ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&local_3a0);
    if (bVar19) {
      return __return_storage_ptr__;
    }
    goto LAB_001ebeb5;
  case STI_VECTOR256:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 == '\0') || (cVar1 == '\x06')) {
      local_3b0._0_8_ = &PTR__STVector256_002f83c0;
      local_390._M_allocated_capacity = 0;
      local_3a0._M_allocated_capacity = 0;
      local_3a0._8_8_ = 0;
      local_3b0._8_8_ = name_00;
      for (UVar16 = 0; UVar8 = Json::Value::size((Value *)name), UVar16 < UVar8; UVar16 = UVar16 + 1
          ) {
        local_318._0_8_ = 0;
        local_318._8_8_ = 0;
        local_328._0_8_ = (undefined **)0x0;
        local_328._8_8_ = (SField *)0x0;
        pVVar13 = Json::Value::operator[]((Value *)name,UVar16);
        Json::Value::asString_abi_cxx11_((string *)local_368,pVVar13);
        base_uint<256UL,_void>::SetHex
                  ((base_uint<256UL,_void> *)local_328,(char *)local_368._0_8_,false);
        std::__cxx11::string::~string((string *)local_368);
        std::
        vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
        push_back((vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                   *)&local_3a0,(base_uint<256UL,_void> *)local_328);
      }
      detail::make_stvar<jbcoin::STVector256,jbcoin::STVector256>
                ((STVar *)local_328,(detail *)local_3b0,args_00);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_328);
      detail::STVar::~STVar((STVar *)local_328);
      STVector256::~STVector256((STVector256 *)local_3b0);
      return __return_storage_ptr__;
    }
    array_expected((STParsedJSONDetail *)local_328,json_name,fieldName);
LAB_001eacf3:
    Json::Value::swap(value,(Value *)local_328);
    Json::Value::~Value((Value *)local_328);
    return __return_storage_ptr__;
  }
  detail::STVar::~STVar((STVar *)local_328);
  this_00 = (string *)local_3b0;
LAB_001eb93e:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

static boost::optional<detail::STVar> parseLeaf (
    std::string const& json_name,
    std::string const& fieldName,
    SField const* name,
    Json::Value const& value,
    Json::Value& error)
{
    boost::optional <detail::STVar> ret;

    auto const& field = SField::getField (fieldName);

    if (field == sfInvalid)
    {
        error = unknown_field (json_name, fieldName);
        return ret;
    }

    switch (field.fieldType)
    {
    case STI_UINT8:
        try
        {
            constexpr auto minValue = std::numeric_limits<std::uint8_t>::min();
            constexpr auto maxValue = std::numeric_limits<std::uint8_t>::max();
            if (value.isString ())
            {
                std::string const strValue = value.asString();

                if (!strValue.empty() &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionResult)
                    {
                        auto ter = transCode(strValue);

                        if (!ter || *ter < minValue || *ter > maxValue)
                        {
                            error = out_of_range(json_name, fieldName);
                            return ret;
                        }

                        ret = detail::make_stvar<STUInt8>(field,
                            static_cast<std::uint8_t>(*ter));
                    }
                    else
                    {
                        error = bad_type(json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt8>(field,
                        beast::lexicalCastThrow <std::uint8_t>(strValue));
                }
            }
            else if (value.isInt ())
            {
                if (value.asInt () < minValue || value.asInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                if (value.asUInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }
        break;

    case STI_UINT16:
        try
        {
            if (value.isString ())
            {
                std::string const strValue = value.asString ();

                if (! strValue.empty () &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionType)
                    {
                        TxType const txType (TxFormats::getInstance().
                            findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (txType));

                        if (*name == sfGeneric)
                            name = &sfTransaction;
                    }
                    else if (field == sfLedgerEntryType)
                    {
                        LedgerEntryType const type (
                            LedgerFormats::getInstance().
                                findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (type));

                        if (*name == sfGeneric)
                            name = &sfLedgerEntry;
                    }
                    else
                    {
                        error = invalid_data (json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt16> (field,
                        beast::lexicalCastThrow <std::uint16_t> (strValue));
                }
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT32:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    beast::lexicalCastThrow <std::uint32_t> (
                        value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    to_unsigned <std::uint32_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    static_cast <std::uint32_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT64:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    uintFromHex (value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    to_unsigned<std::uint64_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    static_cast <std::uint64_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH128:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash128> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH160:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash160> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH256:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash256> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VL:
        if (! value.isString ())
        {
            error = bad_type (json_name, fieldName);
            return ret;
        }

        try
        {
            std::pair<Blob, bool> vBlob (strUnHex (value.asString ()));

            if (! vBlob.second)
                Throw<std::invalid_argument> ("invalid data");

            ret = detail::make_stvar <STBlob> (field, vBlob.first.data (),
                                             vBlob.first.size ());
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_AMOUNT:
        try
        {
            ret = detail::make_stvar <STAmount> (amountFromJson (field, value));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VECTOR256:
        if (! value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STVector256 tail (field);
            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                uint256 s;
                s.SetHex (value[i].asString ());
                tail.push_back (s);
            }
            ret = detail::make_stvar <STVector256> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_PATHSET:
        if (!value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STPathSet tail (field);

            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                STPath p;

                if (!value[i].isArray ())
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "]";
                    error = array_expected (json_name, ss.str ());
                    return ret;
                }

                for (Json::UInt j = 0; value[i].isValidIndex (j); ++j)
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "][" << j << "]";
                    std::string const element_name (
                        json_name + "." + ss.str());

                    // each element in this path has some combination of
                    // account, currency, or issuer

                    Json::Value pathEl = value[i][j];

                    if (!pathEl.isObject ())
                    {
                        error = not_an_object (element_name);
                        return ret;
                    }

                    Json::Value const& account  = pathEl["account"];
                    Json::Value const& currency = pathEl["currency"];
                    Json::Value const& issuer   = pathEl["issuer"];
                    bool hasCurrency            = false;
                    AccountID uAccount, uIssuer;
                    Currency uCurrency;

                    if (account)
                    {
                        // human account id
                        if (! account.isString ())
                        {
                            error = string_expected (element_name, "account");
                            return ret;
                        }

                        // If we have what looks like a 160-bit hex value, we
                        // set it, otherwise, we assume it's an AccountID
                        if (!uAccount.SetHexExact (account.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                account.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "account");
                                return ret;
                            }
                            uAccount = *a;
                        }
                    }

                    if (currency)
                    {
                        // human currency
                        if (!currency.isString ())
                        {
                            error = string_expected (element_name, "currency");
                            return ret;
                        }

                        hasCurrency = true;

                        if (!uCurrency.SetHexExact (currency.asString ()))
                        {
                            if (!to_currency (uCurrency, currency.asString ()))
                            {
                                error = invalid_data (element_name, "currency");
                                return ret;
                            }
                        }
                    }

                    if (issuer)
                    {
                        // human account id
                        if (!issuer.isString ())
                        {
                            error = string_expected (element_name, "issuer");
                            return ret;
                        }

                        if (!uIssuer.SetHexExact (issuer.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                issuer.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "issuer");
                                return ret;
                            }
                            uIssuer = *a;
                        }
                    }

                    p.emplace_back (uAccount, uCurrency, uIssuer, hasCurrency);
                }

                tail.push_back (p);
            }
            ret = detail::make_stvar <STPathSet> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_ACCOUNT:
        {
            if (! value.isString ())
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }

            std::string const strValue = value.asString ();

            try
            {
                // VFALCO This needs careful auditing
                auto const account =
                    parseHexOrBase58<AccountID>(
                        strValue);
                if (! account)
                {
                    error = invalid_data (json_name, fieldName);
                    return ret;
                }
                ret = detail::make_stvar <STAccount>(
                    field, *account);
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return ret;
            }
        }
        break;

    default:
        error = bad_type (json_name, fieldName);
        return ret;
    }

    return ret;
}